

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

bool __thiscall
metaf::VisibilityGroup::appendRunway(VisibilityGroup *this,string *group,IncompleteText next)

{
  Type TVar1;
  optional<metaf::Runway> oVar2;
  
  oVar2 = Runway::fromString(group,true);
  if (((undefined1  [12])
       oVar2.super__Optional_base<metaf::Runway,_true,_true>._M_payload.
       super__Optional_payload_base<metaf::Runway> & (undefined1  [12])0x1) == (undefined1  [12])0x0
     ) goto LAB_0018a017;
  (this->rw).super__Optional_base<metaf::Runway,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Runway>._M_payload =
       oVar2.super__Optional_base<metaf::Runway,_true,_true>._M_payload.
       super__Optional_payload_base<metaf::Runway>._M_payload;
  (this->rw).super__Optional_base<metaf::Runway,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Runway>._M_engaged =
       oVar2.super__Optional_base<metaf::Runway,_true,_true>._M_payload.
       super__Optional_payload_base<metaf::Runway>._M_engaged;
  if (this->visType == PREVAILING) {
    TVar1 = RUNWAY;
LAB_0018a00f:
    this->visType = TVar1;
  }
  else if (this->visType == VARIABLE_PREVAILING) {
    TVar1 = VARIABLE_RUNWAY;
    goto LAB_0018a00f;
  }
  this->incompleteText = next;
LAB_0018a017:
  return (bool)(oVar2.super__Optional_base<metaf::Runway,_true,_true>._M_payload.
                super__Optional_payload_base<metaf::Runway>._M_engaged & 1);
}

Assistant:

bool VisibilityGroup::appendRunway(const std::string & group, IncompleteText next) {
	const auto r = Runway::fromString(group, true);
	if (!r.has_value()) return false;
	rw = r;
	if (type() == Type::PREVAILING) visType = Type::RUNWAY;
	if (type() == Type::VARIABLE_PREVAILING) visType = Type::VARIABLE_RUNWAY;
	incompleteText = next;
	return true;
}